

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Board.cpp
# Opt level: O1

void __thiscall Board::generateBoard(Board *this)

{
  pointer puVar1;
  undefined1 auVar2 [16];
  int iVar3;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  _Var4;
  ulong uVar5;
  ulong srcRow;
  size_t srcCol;
  int i;
  int iVar6;
  size_t sVar7;
  vector<Move,_std::allocator<Move>_> moves;
  vector<Move,_std::allocator<Move>_> local_58;
  Move local_40 [4];
  
  puVar1 = (this->values).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  _Var4 = std::
          __find_if<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_equals_val<unsigned_long_const>>
                    (puVar1,(this->values).
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_finish,&this->nullValue);
  uVar5 = (ulong)((long)_Var4._M_current - (long)puVar1) >> 3 & 0xffffffff;
  iVar6 = 0;
  uVar5 = uVar5 % this->sizeInt + (uVar5 / this->sizeInt) * 10;
  std::vector<Move,_std::allocator<Move>_>::vector(&local_58,4,(allocator_type *)local_40);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = uVar5;
  srcRow = SUB168(auVar2 * ZEXT816(0x199999999999999a),8);
  srcCol = uVar5 + srcRow * -10;
  do {
    if (local_58.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.super__Vector_impl_data.
        _M_finish !=
        local_58.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.super__Vector_impl_data.
        _M_start) {
      local_58.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.super__Vector_impl_data.
      _M_finish = local_58.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.
                  super__Vector_impl_data._M_start;
    }
    local_40[0] = UP;
    local_40[1] = 1;
    local_40[2] = 2;
    local_40[3] = 3;
    std::vector<Move,std::allocator<Move>>::_M_range_insert<Move_const*>
              ((vector<Move,std::allocator<Move>> *)&local_58,
               local_58.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.
               super__Vector_impl_data._M_start,local_40,&stack0xffffffffffffffd0);
    while( true ) {
      iVar3 = rand();
      local_40[0] = local_58.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.
                    super__Vector_impl_data._M_start
                    [(ulong)(long)iVar3 %
                     (ulong)((long)local_58.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.
                                   super__Vector_impl_data._M_finish -
                             (long)local_58.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.
                                   super__Vector_impl_data._M_start >> 2)];
      if ((local_40[0] == UP) && (srcRow != 0)) {
        sVar7 = srcRow - 1;
        makeMove(this,srcRow,srcCol,sVar7,srcCol);
        goto LAB_00109424;
      }
      sVar7 = srcRow;
      if (local_40[0] == DOWN) {
        if (srcRow < this->sizeInt - 1) {
          makeMove(this,srcRow,srcCol,srcRow + 1,srcCol);
          sVar7 = srcRow + 1;
          goto LAB_00109424;
        }
      }
      else if ((local_40[0] == RIGHT) && (srcCol < this->sizeInt - 1)) {
        makeMove(this,srcRow,srcCol,srcRow,srcCol + 1);
        srcCol = srcCol + 1;
        goto LAB_00109424;
      }
      if ((local_40[0] == LEFT) && (srcCol != 0)) break;
      std::
      __remove_if<__gnu_cxx::__normal_iterator<Move*,std::vector<Move,std::allocator<Move>>>,__gnu_cxx::__ops::_Iter_equals_val<Move_const>>
                ((__normal_iterator<Move_*,_std::vector<Move,_std::allocator<Move>_>_>)
                 local_58.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 (__normal_iterator<Move_*,_std::vector<Move,_std::allocator<Move>_>_>)
                 local_58.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.
                 super__Vector_impl_data._M_finish,(_Iter_equals_val<const_Move>)local_40);
    }
    makeMove(this,srcRow,srcCol,srcRow,srcCol - 1);
    srcCol = srcCol - 1;
LAB_00109424:
    iVar6 = iVar6 + 1;
    srcRow = sVar7;
    if (iVar6 == 4000) {
      if (local_58.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.super__Vector_impl_data.
          _M_start != (Move *)0x0) {
        operator_delete(local_58.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_58.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_58.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      return;
    }
  } while( true );
}

Assistant:

void Board::generateBoard()
{
    size_t emptyTile = findEmptyTilePosition();
    size_t emptyRow = emptyTile / 10;
    size_t emptyCol = emptyTile % 10;

    std::vector<Move> moves( 4 );
    using enum Move;

    for ( int i = 0; i < 4000; i++ )
    {
        moves.clear();
        moves.insert( moves.begin(), { UP, RIGHT, DOWN, LEFT });
        Move move = moves.at( rand() % moves.size() );

        while( true )
        {
            if (( move == UP ) && ( emptyRow > 0 ))
            {
                makeMove( emptyRow, emptyCol, emptyRow - 1, emptyCol );
                emptyRow--;
                break;
            }
            if (( move == RIGHT ) && ( emptyCol < ( sizeInt - 1 )))
            {
                makeMove( emptyRow, emptyCol, emptyRow, emptyCol + 1 );
                emptyCol++;
                break;
            }
            if (( move == DOWN ) && ( emptyRow < ( sizeInt - 1 )))
            {
                makeMove( emptyRow, emptyCol, emptyRow + 1, emptyCol );
                emptyRow++;
                break;
            }
            if (( move == LEFT ) && ( emptyCol > 0 ))
            {
                makeMove( emptyRow, emptyCol, emptyRow, emptyCol - 1 );
                emptyCol--;
                break;
            }

            std::remove( moves.begin(), moves.end(), move );
            move = moves[ rand() % moves.size() ];
        }
    }
}